

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::StatsBindData::Copy(StatsBindData *this)

{
  undefined8 *puVar1;
  long in_RSI;
  undefined8 *local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  puVar1 = (undefined8 *)operator_new(0x28);
  local_48 = &local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,*(long *)(in_RSI + 8),
             *(long *)(in_RSI + 0x10) + *(long *)(in_RSI + 8));
  *puVar1 = &PTR__StatsBindData_00891ba0;
  puVar1[1] = puVar1 + 3;
  if (local_48 == &local_38) {
    puVar1[3] = local_38;
    puVar1[4] = uStack_30;
  }
  else {
    puVar1[1] = local_48;
    puVar1[3] = local_38;
  }
  puVar1[2] = local_40;
  *(undefined8 **)this = puVar1;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> Copy() const override {
		return make_uniq<StatsBindData>(stats);
	}